

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  char *pcVar9;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  byte bVar14;
  bool bVar15;
  byte *local_50;
  int local_44;
  char *local_40;
  char *local_38;
  
  if (end <= ptr) {
    return -4;
  }
  uVar6 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pcVar13 = ptr + uVar6;
  if (uVar6 == 0) {
    pcVar13 = end;
  }
  bVar15 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar15) {
    pcVar13 = end;
  }
  if (bVar15 && uVar6 == 0) {
    return -1;
  }
  bVar4 = ptr[1];
  if (bVar4 - 0xd8 < 4) {
switchD_0044afbe_caseD_7:
    if ((long)pcVar13 - (long)ptr < 4) {
      return -2;
    }
    pbVar10 = (byte *)(ptr + 4);
    goto LAB_0044b03e;
  }
  if (bVar4 - 0xdc < 4) {
switchD_0044afbe_caseD_0:
    *nextTokPtr = ptr;
    return 0;
  }
  if (bVar4 == 0) {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 0:
    case 1:
    case 8:
      goto switchD_0044afbe_caseD_0;
    case 2:
      pbVar8 = (byte *)(ptr + 2);
      uVar6 = (long)pcVar13 - (long)pbVar8;
      if ((long)uVar6 < 2) {
        return -1;
      }
      bVar4 = ptr[3];
      if (bVar4 - 0xd8 < 4) {
switchD_0044b226_caseD_7:
        if (uVar6 < 4) {
          return -2;
        }
        goto switchD_0044b226_caseD_5;
      }
      if (bVar4 - 0xdc < 4) goto switchD_0044b226_caseD_5;
      if (bVar4 == 0) {
        uVar5 = (uint)*pbVar8;
        cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar8);
        switch(cVar1) {
        case '\x05':
        case '\b':
        case '\t':
        case '\n':
        case '\v':
        case '\f':
        case '\r':
        case '\x0e':
        case '\x12':
        case '\x13':
        case '\x14':
        case '\x15':
        case '\x17':
          break;
        case '\x06':
          if (uVar6 == 2) {
            return -2;
          }
          break;
        case '\a':
          goto switchD_0044b226_caseD_7;
        case '\x0f':
          iVar2 = little2_scanPi(enc,ptr + 4,pcVar13,nextTokPtr);
          return iVar2;
        case '\x10':
          pbVar8 = (byte *)(ptr + 4);
          if ((long)pcVar13 - (long)pbVar8 < 2) {
            return -1;
          }
          if (ptr[5] == '\0') {
            cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar8);
            if (cVar1 == '\x14') {
              pcVar9 = ptr + 6;
              if ((long)pcVar13 - (long)pcVar9 < 0xc) {
                return -1;
              }
              lVar11 = 0;
              iVar2 = 8;
              do {
                pcVar13 = ptr + 0x12;
                if (lVar11 == 6) {
LAB_0044b6ff:
                  *nextTokPtr = pcVar13;
                  return iVar2;
                }
                if ((pcVar9[1] != '\0') || (*pcVar9 != (&big2_scanCdataSection_CDATA_LSQB)[lVar11]))
                {
                  iVar2 = 0;
                  pcVar13 = pcVar9;
                  goto LAB_0044b6ff;
                }
                lVar11 = lVar11 + 1;
                pcVar9 = pcVar9 + 2;
              } while( true );
            }
            if (cVar1 == '\x1b') {
              iVar2 = little2_scanComment(enc,ptr + 6,pcVar13,nextTokPtr);
              return iVar2;
            }
          }
          break;
        case '\x11':
          pbVar10 = (byte *)(ptr + 4);
          uVar6 = (long)pcVar13 - (long)pbVar10;
          if ((long)uVar6 < 2) {
            return -1;
          }
          bVar4 = ptr[5];
          iVar2 = 0;
          if (bVar4 - 0xd8 < 4) {
LAB_0044b5e1:
            if (uVar6 < 4) {
              return -2;
            }
          }
          else {
            if (bVar4 - 0xdc < 4) goto LAB_0044b71d;
            if (bVar4 == 0) {
              bVar14 = *pbVar10;
              cVar1 = *(char *)((long)enc[1].scanners + (ulong)bVar14);
              if (cVar1 == '\x06') {
                if (uVar6 == 2) {
                  return -2;
                }
                goto LAB_0044b71d;
              }
              if (cVar1 == '\a') goto LAB_0044b5e1;
              if (cVar1 == '\x16') goto LAB_0044b62a;
              if (cVar1 != '\x1d') {
                if (cVar1 != '\x18') goto LAB_0044b71d;
                goto LAB_0044b62a;
              }
            }
            else if (bVar4 == 0xff) {
              bVar14 = *pbVar10;
              if (0xfd < bVar14) goto LAB_0044b71d;
            }
            else {
              bVar14 = *pbVar10;
            }
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(bVar14 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar4] << 5)
                          ) >> (bVar14 & 0x1f) & 1) != 0) {
LAB_0044b62a:
              lVar11 = 6;
              lVar7 = 0;
LAB_0044b647:
              if ((long)(pcVar13 + (lVar7 - (long)ptr) + -6) < 2) {
                return -1;
              }
              bVar4 = ptr[lVar11 + 1];
              if (bVar4 != 0) {
                if (bVar4 == 0xff) {
                  uVar5 = (uint)(byte)ptr[lVar11];
                  if ((byte)ptr[lVar11] < 0xfe) goto switchD_0044b6e6_caseD_1d;
                }
                else {
                  if (bVar4 - 0xd8 < 4) goto switchD_0044b6e6_caseD_7;
                  if (3 < bVar4 - 0xdc) {
                    uVar5 = (uint)(byte)ptr[lVar11];
                    goto switchD_0044b6e6_caseD_1d;
                  }
                }
                goto switchD_0044b6e6_caseD_8;
              }
              uVar5 = (uint)(byte)ptr[lVar11];
              switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar11])) {
              case 6:
                if (pcVar13 + (lVar7 - (long)ptr) == (char *)0x8) {
                  return -2;
                }
                break;
              case 7:
switchD_0044b6e6_caseD_7:
                if (pcVar13 + (lVar7 - (long)ptr) + -6 < (char *)0x4) {
                  return -2;
                }
                break;
              case 9:
              case 10:
              case 0x15:
                pcVar13 = pcVar13 + (lVar7 - (long)ptr) + -8;
                pbVar10 = (byte *)(ptr + (8 - lVar7));
                iVar2 = 0;
                goto LAB_0044baf9;
              case 0xb:
                pbVar10 = (byte *)(ptr + (8 - lVar7));
                iVar2 = 5;
                goto LAB_0044b71d;
              case 0x16:
              case 0x18:
              case 0x19:
              case 0x1a:
              case 0x1b:
                goto switchD_0044b6e6_caseD_16;
              case 0x1d:
switchD_0044b6e6_caseD_1d:
                if ((*(uint *)((long)namingBitmap +
                              (ulong)(uVar5 >> 3 & 0x1c |
                                     (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar4] << 5)) >>
                     (uVar5 & 0x1f) & 1) != 0) goto switchD_0044b6e6_caseD_16;
              }
switchD_0044b6e6_caseD_8:
              pbVar10 = (byte *)(ptr + (6 - lVar7));
              iVar2 = 0;
            }
          }
LAB_0044b71d:
          *nextTokPtr = (char *)pbVar10;
          return iVar2;
        case '\x16':
        case '\x18':
          goto switchD_0044b226_caseD_16;
        default:
          if (cVar1 != '\x1d') break;
          goto LAB_0044b24a;
        }
      }
      else {
        if (bVar4 == 0xff) {
          uVar5 = (uint)*pbVar8;
          if (0xfd < *pbVar8) goto switchD_0044b226_caseD_5;
        }
        else {
          uVar5 = (uint)*pbVar8;
        }
LAB_0044b24a:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(uVar5 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar4] << 5)) >>
             (uVar5 & 0x1f) & 1) != 0) {
switchD_0044b226_caseD_16:
          lVar11 = 4;
          lVar7 = 0;
LAB_0044b298:
          if ((long)(pcVar13 + (lVar7 - (long)ptr) + -4) < 2) {
            return -1;
          }
          bVar4 = ptr[lVar11 + 1];
          if (bVar4 != 0) {
            if (bVar4 == 0xff) {
              uVar5 = (uint)(byte)ptr[lVar11];
              if ((byte)ptr[lVar11] < 0xfe) goto switchD_0044b33e_caseD_1d;
            }
            else {
              if (bVar4 - 0xd8 < 4) goto switchD_0044b33e_caseD_7;
              if (3 < bVar4 - 0xdc) {
                uVar5 = (uint)(byte)ptr[lVar11];
                goto switchD_0044b33e_caseD_1d;
              }
            }
            goto switchD_0044b33e_caseD_5;
          }
          uVar5 = (uint)(byte)ptr[lVar11];
          switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar11])) {
          case 6:
            if (pcVar13 + (lVar7 - (long)ptr) == (char *)0x6) {
              return -2;
            }
            break;
          case 7:
switchD_0044b33e_caseD_7:
            if (pcVar13 + (lVar7 - (long)ptr) + -4 < (char *)0x4) {
              return -2;
            }
            break;
          case 9:
          case 10:
          case 0x15:
            pcVar9 = pcVar13 + (lVar7 - (long)ptr) + -8;
            ptr = ptr + (6 - lVar7);
            goto LAB_0044b46f;
          case 0xb:
            ptr = ptr + (4 - lVar7);
            goto switchD_0044b4a4_caseD_b;
          case 0x11:
            ptr = ptr + (4 - lVar7);
            goto switchD_0044b4a4_caseD_11;
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
            goto switchD_0044b33e_caseD_16;
          case 0x1d:
switchD_0044b33e_caseD_1d:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(uVar5 >> 3 & 0x1c |
                                 (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar4] << 5)) >>
                 (uVar5 & 0x1f) & 1) != 0) goto switchD_0044b33e_caseD_16;
          }
switchD_0044b33e_caseD_5:
          ptr = ptr + (4 - lVar7);
          goto switchD_0044afbe_caseD_0;
        }
      }
      goto switchD_0044b226_caseD_5;
    case 3:
      iVar2 = little2_scanRef(enc,ptr + 2,pcVar13,nextTokPtr);
      return iVar2;
    case 4:
      pbVar10 = (byte *)(ptr + 2);
      if ((long)pcVar13 - (long)pbVar10 < 2) {
        return -5;
      }
      if ((ptr[3] == '\0') && (*pbVar10 == 0x5d)) {
        pcVar9 = ptr + 4;
        if ((long)pcVar13 - (long)pcVar9 < 2) {
          return -5;
        }
        if ((ptr[5] == '\0') && (*pcVar9 == '>')) {
          *nextTokPtr = pcVar9;
          return 0;
        }
      }
      break;
    case 5:
      if ((long)pcVar13 - (long)ptr < 2) {
        return -2;
      }
    default:
switchD_0044afbe_default:
      pbVar10 = (byte *)(ptr + 2);
      break;
    case 6:
      if ((long)pcVar13 - (long)ptr < 3) {
        return -2;
      }
      pbVar10 = (byte *)(ptr + 3);
      break;
    case 7:
      goto switchD_0044afbe_caseD_7;
    case 9:
      pcVar9 = ptr + 2;
      if (1 < (long)pcVar13 - (long)pcVar9) {
        if ((ptr[3] == '\0') && (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[2]) == '\n')) {
          pcVar9 = ptr + 4;
        }
        *nextTokPtr = pcVar9;
        return 7;
      }
      return -3;
    case 10:
      *nextTokPtr = ptr + 2;
      return 7;
    }
LAB_0044b03e:
    do {
      while( true ) {
        pbVar8 = pbVar10;
        uVar6 = (long)pcVar13 - (long)pbVar8;
        if ((long)uVar6 < 2) goto switchD_0044b0b3_caseD_0;
        bVar4 = pbVar8[1];
        if (3 < bVar4 - 0xd8) break;
switchD_0044b0b3_caseD_7:
        if (uVar6 < 4) goto switchD_0044b0b3_caseD_0;
        pbVar10 = pbVar8 + 4;
      }
      if (bVar4 == 0) {
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar8)) {
        case 4:
          goto switchD_0044b0b3_caseD_4;
        default:
          goto switchD_0044b0b3_caseD_5;
        case 6:
          if (uVar6 != 2) {
            pbVar10 = pbVar8 + 3;
            goto LAB_0044b03e;
          }
        case 0:
        case 1:
        case 2:
        case 3:
        case 8:
        case 9:
        case 10:
switchD_0044b0b3_caseD_0:
          *nextTokPtr = (char *)pbVar8;
          return 6;
        case 7:
          goto switchD_0044b0b3_caseD_7;
        }
      }
      if (bVar4 == 0xff) {
        if (0xfd < *pbVar8) goto switchD_0044b0b3_caseD_0;
      }
      else if (bVar4 - 0xdc < 4) goto switchD_0044b0b3_caseD_0;
switchD_0044b0b3_caseD_5:
      pbVar10 = pbVar8 + 2;
    } while( true );
  }
  if ((bVar4 == 0xff) && (0xfd < (byte)*ptr)) goto switchD_0044afbe_caseD_0;
  goto switchD_0044afbe_default;
switchD_0044b6e6_caseD_16:
  lVar7 = lVar7 + -2;
  lVar11 = lVar11 + 2;
  goto LAB_0044b647;
LAB_0044baf9:
  if ((long)pcVar13 < 2) {
    return -1;
  }
  if (pbVar10[1] != 0) goto LAB_0044b71d;
  bVar4 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar10);
  if ((1 < bVar4 - 9) && (bVar4 != 0x15)) {
    if (bVar4 == 0xb) {
      pbVar10 = pbVar10 + 2;
      iVar2 = 5;
    }
    goto LAB_0044b71d;
  }
  pbVar10 = pbVar10 + 2;
  pcVar13 = pcVar13 + -2;
  goto LAB_0044baf9;
switchD_0044b33e_caseD_16:
  lVar7 = lVar7 + -2;
  lVar11 = lVar11 + 2;
  goto LAB_0044b298;
LAB_0044b46f:
  if ((long)(pcVar9 + 2) < 2) {
    return -1;
  }
  bVar4 = ((byte *)ptr)[1];
  uVar6 = (ulong)bVar4;
  if (bVar4 == 0) {
    bVar4 = *ptr;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)bVar4)) {
    default:
      goto switchD_0044afbe_caseD_0;
    case 6:
      if (pcVar9 == (char *)0x0) {
        return -2;
      }
      goto switchD_0044afbe_caseD_0;
    case 7:
      goto switchD_0044b4a4_caseD_7;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0044b4a4_caseD_9;
    case 0xb:
      goto switchD_0044b4a4_caseD_b;
    case 0x11:
      goto switchD_0044b4a4_caseD_11;
    case 0x16:
    case 0x18:
      goto switchD_0044b4a4_caseD_16;
    case 0x1d:
      uVar6 = 0;
    }
  }
  else {
    if (bVar4 - 0xd8 < 4) {
switchD_0044b4a4_caseD_7:
      if (pcVar9 + 2 < (char *)0x4) {
        return -2;
      }
      goto switchD_0044afbe_caseD_0;
    }
    if (bVar4 - 0xdc < 4) goto switchD_0044afbe_caseD_0;
    if (bVar4 != 0xff) {
      bVar4 = *ptr;
      goto LAB_0044b737;
    }
    bVar4 = *ptr;
    uVar6 = 0xff;
    if (0xfd < bVar4) goto switchD_0044afbe_caseD_0;
  }
LAB_0044b737:
  if ((*(uint *)((long)namingBitmap +
                (ulong)(bVar4 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[uVar6] << 5)) >>
       (bVar4 & 0x1f) & 1) == 0) goto switchD_0044afbe_caseD_0;
switchD_0044b4a4_caseD_16:
  pbVar10 = (byte *)ptr + 2;
  local_40 = pcVar13 + -2;
  local_38 = pcVar13 + -4;
  goto LAB_0044b779;
switchD_0044b82a_caseD_16:
  pbVar10 = pbVar10 + 2;
  goto LAB_0044b779;
LAB_0044b9e7:
  if ((long)uVar12 < 2) {
    return -1;
  }
  pbVar8 = pbVar8 + 2;
  bVar4 = local_50[lVar11 + 5];
  if (bVar4 != 0) {
    if (bVar4 - 0xd8 < 4) goto switchD_0044ba2b_caseD_7;
    if ((3 < bVar4 - 0xdc) && ((bVar4 != 0xff || (local_50[lVar11 + 4] < 0xfe))))
    goto switchD_0044ba2b_caseD_1d;
    goto switchD_0044ba2b_caseD_8;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)local_50[lVar11 + 4])) {
  case 6:
    if (uVar6 - 6 == lVar11) {
      return -2;
    }
    break;
  case 7:
switchD_0044ba2b_caseD_7:
    if (uVar12 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    goto switchD_0044ba2b_caseD_9;
  case 0xb:
    local_50 = local_50 + lVar11 + 2;
LAB_0044bc0a:
    local_50 = local_50 + 4;
    local_44 = 1;
    goto switchD_0044b82a_caseD_8;
  case 0x11:
    pbVar8 = local_50 + lVar11 + 4;
LAB_0044bbb4:
    pbVar10 = pbVar8 + 2;
    if ((long)pcVar13 - (long)pbVar10 < 2) {
      return -1;
    }
    if (pbVar8[3] == 0) {
      if (pbVar8[2] == 0x3e) {
        pbVar10 = pbVar8 + 4;
      }
      local_44 = (uint)(pbVar8[2] == 0x3e) * 3;
    }
    goto LAB_0044bc18;
  case 0x16:
  case 0x18:
    goto switchD_0044ba2b_caseD_16;
  case 0x1d:
switchD_0044ba2b_caseD_1d:
    pbVar10 = pbVar8;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[local_50[lVar11 + 5]] << 5 |
                         local_50[lVar11 + 4] >> 3 & 0x1c)) >> (local_50[lVar11 + 4] & 0x1f) & 1) ==
        0) goto LAB_0044bc18;
    goto LAB_0044bab8;
  }
switchD_0044ba2b_caseD_8:
  pbVar10 = local_50 + lVar11 + 4;
  goto LAB_0044bc18;
switchD_0044ba2b_caseD_16:
LAB_0044bab8:
  pbVar10 = local_50 + lVar11 + 6;
  goto LAB_0044b779;
switchD_0044ba2b_caseD_9:
  lVar11 = lVar11 + 2;
  uVar12 = uVar12 - 2;
  goto LAB_0044b9e7;
switchD_0044b4a4_caseD_11:
  pbVar8 = (byte *)ptr + 2;
  if ((long)pcVar13 - (long)pbVar8 < 2) {
    return -1;
  }
  if ((((byte *)ptr)[3] == 0) && (*pbVar8 == 0x3e)) {
    *nextTokPtr = (char *)((byte *)ptr + 4);
    return 4;
  }
  goto switchD_0044b226_caseD_5;
switchD_0044b4a4_caseD_9:
  ptr = (char *)((byte *)ptr + 2);
  pcVar9 = pcVar9 + -2;
  goto LAB_0044b46f;
switchD_0044b4a4_caseD_b:
  *nextTokPtr = (char *)((byte *)ptr + 2);
  return 2;
LAB_0044b779:
  uVar6 = (long)pcVar13 - (long)pbVar10;
  if ((long)uVar6 < 2) {
    return -1;
  }
  bVar4 = pbVar10[1];
  local_44 = 0;
  local_50 = pbVar10;
  if (bVar4 != 0) {
    if (bVar4 == 0xff) {
      uVar5 = (uint)*pbVar10;
      if (*pbVar10 < 0xfe) goto switchD_0044b82a_caseD_1d;
    }
    else {
      if (bVar4 - 0xd8 < 4) goto switchD_0044b82a_caseD_7;
      if (3 < bVar4 - 0xdc) {
        uVar5 = (uint)*pbVar10;
        goto switchD_0044b82a_caseD_1d;
      }
    }
    goto switchD_0044b82a_caseD_8;
  }
  uVar5 = (uint)*pbVar10;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar10)) {
  case 6:
    if (uVar6 == 2) {
      return -2;
    }
    goto LAB_0044bc18;
  case 7:
switchD_0044b82a_caseD_7:
    if (uVar6 < 4) {
      return -2;
    }
    goto LAB_0044bc18;
  case 9:
  case 10:
  case 0x15:
    lVar11 = (long)local_40 - (long)pbVar10;
    while( true ) {
      local_50 = pbVar10 + 2;
      if (lVar11 < 2) {
        return -1;
      }
      if (pbVar10[3] != 0) goto switchD_0044b82a_caseD_8;
      bVar4 = *(byte *)((long)enc[1].scanners + (ulong)*local_50);
      if ((1 < bVar4 - 9) && (bVar4 != 0x15)) break;
      lVar11 = lVar11 + -2;
      pbVar10 = local_50;
    }
    if (bVar4 == 0xe) goto switchD_0044b82a_caseD_e;
    break;
  case 0xe:
switchD_0044b82a_caseD_e:
    lVar11 = (long)local_40 - (long)local_50;
    pbVar10 = local_50;
    while( true ) {
      local_50 = pbVar10 + 2;
      if (lVar11 < 2) {
        return -1;
      }
      if (pbVar10[3] != 0) break;
      uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_50);
      if ((uVar5 & 0xfffffffe) == 0xc) {
switchD_0044b94f_caseD_4:
        local_50 = local_50 + 2;
        do {
          uVar6 = (long)pcVar13 - (long)local_50;
          if ((long)uVar6 < 2) {
            return -1;
          }
          bVar4 = local_50[1];
          uVar3 = 7;
          if (3 < bVar4 - 0xd8) {
            if (bVar4 - 0xdc < 4) {
              uVar3 = 8;
            }
            else if (bVar4 == 0xff) {
              uVar3 = 0;
              if (*local_50 < 0xfe) goto LAB_0044b932;
            }
            else if (bVar4 == 0) {
              uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_50);
            }
            else {
LAB_0044b932:
              uVar3 = 0x1d;
            }
          }
          if (uVar3 == uVar5) {
            pbVar8 = local_50 + 2;
            if ((long)pcVar13 - (long)pbVar8 < 2) {
              return -1;
            }
            pbVar10 = pbVar8;
            if (local_50[3] != 0) goto LAB_0044bc18;
            bVar4 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar8);
            if ((bVar4 - 9 < 2) || (bVar4 == 0x15)) {
              uVar12 = (long)local_38 - (long)local_50;
              lVar11 = 0;
              goto LAB_0044b9e7;
            }
            if (bVar4 == 0xb) goto LAB_0044bc0a;
            if (bVar4 != 0x11) goto LAB_0044bc18;
            goto LAB_0044bbb4;
          }
          switch(uVar3) {
          case 0:
          case 1:
          case 2:
          case 8:
            goto switchD_0044b82a_caseD_8;
          case 3:
            iVar2 = little2_scanRef(enc,(char *)(local_50 + 2),pcVar13,(char **)&local_50);
            if (iVar2 < 1) {
              pbVar10 = local_50;
              if (iVar2 != 0) {
                return iVar2;
              }
              goto LAB_0044bc18;
            }
            break;
          default:
            goto switchD_0044b94f_caseD_4;
          case 6:
            if (uVar6 == 2) {
              return -2;
            }
            local_50 = local_50 + 3;
            break;
          case 7:
            if (uVar6 < 4) {
              return -2;
            }
            local_50 = local_50 + 4;
          }
        } while( true );
      }
      if ((0x15 < uVar5) || ((0x200600U >> (uVar5 & 0x1f) & 1) == 0)) break;
      lVar11 = lVar11 + -2;
      pbVar10 = local_50;
    }
    break;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_0044b82a_caseD_16;
  case 0x1d:
switchD_0044b82a_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(uVar5 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar4] << 5)) >>
         (uVar5 & 0x1f) & 1) != 0) goto switchD_0044b82a_caseD_16;
  }
switchD_0044b82a_caseD_8:
  pbVar10 = local_50;
LAB_0044bc18:
  *nextTokPtr = (char *)pbVar10;
  return local_44;
switchD_0044b0b3_caseD_4:
  if (uVar6 < 4) goto switchD_0044b0b3_caseD_0;
  pbVar10 = pbVar8 + 2;
  if ((pbVar8[3] != 0) || (*pbVar10 != 0x5d)) goto LAB_0044b03e;
  if (uVar6 < 6) goto switchD_0044b0b3_caseD_0;
  if ((pbVar8[5] != 0) || (pbVar8[4] != 0x3e)) goto LAB_0044b03e;
  pbVar8 = pbVar8 + 4;
switchD_0044b226_caseD_5:
  *nextTokPtr = (char *)pbVar8;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (HAS_CHARS(enc, ptr, end, 3)) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}